

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<int,float&,double_const&>
               (FileLoc *loc,char *fmt,int *args,float *args_1,double *args_2)

{
  FileLoc *in_RDI;
  char *in_R8;
  char *message;
  char local_48 [8];
  double *in_stack_ffffffffffffffc0;
  float *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  
  message = local_48;
  StringPrintf<int,float&,double_const&>
            (in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::c_str();
  ErrorExit(in_RDI,message);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}